

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

void lws_wsi_mux_sibling_disconnect(lws *wsi)

{
  uint *puVar1;
  lws *plVar2;
  lws_log_cx_t *cx;
  lws **pplVar3;
  char *pcVar4;
  lws *plVar5;
  lws **pplVar6;
  
  plVar5 = (wsi->mux).parent_wsi;
  pplVar3 = &(plVar5->mux).child_list;
  do {
    pplVar6 = pplVar3;
    plVar2 = *pplVar6;
    if (plVar2 == (lws *)0x0) goto LAB_001189fc;
    pplVar3 = &(plVar2->mux).sibling_list;
  } while (plVar2 != wsi);
  plVar5 = *pplVar3;
  *pplVar3 = (lws *)0x0;
  *pplVar6 = plVar5;
  cx = (wsi->lc).log_cx;
  pcVar4 = lws_wsi_tag(plVar5);
  _lws_log_cx(cx,lws_log_prepend_wsi,wsi,0x10,"lws_wsi_mux_sibling_disconnect",
              " disentangled from sibling %s",pcVar4);
  plVar5 = (wsi->mux).parent_wsi;
LAB_001189fc:
  puVar1 = &(plVar5->mux).child_count;
  *puVar1 = *puVar1 - 1;
  (wsi->mux).parent_wsi = (lws *)0x0;
  return;
}

Assistant:

void
lws_wsi_mux_sibling_disconnect(struct lws *wsi)
{
	struct lws *wsi2;

	lws_start_foreach_llp(struct lws **, w,
			      wsi->mux.parent_wsi->mux.child_list) {

		/* disconnect from siblings */
		if (*w == wsi) {
			wsi2 = (*w)->mux.sibling_list;
			(*w)->mux.sibling_list = NULL;
			*w = wsi2;
			lwsl_wsi_debug(wsi, " disentangled from sibling %s",
					    lws_wsi_tag(wsi2));
			break;
		}
	} lws_end_foreach_llp(w, mux.sibling_list);
	wsi->mux.parent_wsi->mux.child_count--;

	wsi->mux.parent_wsi = NULL;
}